

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall
Parser::parseExpressionList
          (Parser *this,vector<Expression,_std::allocator<Expression>_> *list,int min,int max)

{
  pointer pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool inUnknownOrFalseBlock;
  Token *token;
  Token *pTVar3;
  ulong uVar4;
  int iVar5;
  int *args;
  char *text;
  bool bVar6;
  Expression exp;
  int local_68;
  int local_64;
  Expression local_60;
  Expression local_48;
  
  args = &local_68;
  local_68 = max;
  local_64 = min;
  std::vector<Expression,_std::allocator<Expression>_>::clear(list);
  iVar5 = 0x20;
  if (-1 < local_68) {
    iVar5 = local_68;
  }
  std::vector<Expression,_std::allocator<Expression>_>::reserve(list,(long)iVar5);
  token = Tokenizer::peekToken
                    ((this->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  pCVar1 = (this->conditionStack).
           super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  bVar6 = true;
  if (pCVar1[-1].inTrueBlock == true) {
    bVar6 = pCVar1[-1].inUnknownBlock;
  }
  ::parseExpression(&local_60,
                    (this->entries).
                    super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,bVar6);
  std::vector<Expression,_std::allocator<Expression>_>::push_back(list,&local_60);
  bVar6 = local_60.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0;
  if (!bVar6) {
    printError<>(this,token,"Parameter failure");
    Tokenizer::skipLookahead
              ((this->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer);
  }
  while( true ) {
    pTVar3 = Tokenizer::peekToken
                       ((this->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
    if (pTVar3->type != Comma) break;
    Tokenizer::eatTokens
              ((this->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer,1);
    pCVar1 = (this->conditionStack).
             super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    inUnknownOrFalseBlock = true;
    if (pCVar1[-1].inTrueBlock == true) {
      inUnknownOrFalseBlock = pCVar1[-1].inUnknownBlock;
    }
    ::parseExpression(&local_48,
                      (this->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,inUnknownOrFalseBlock)
    ;
    _Var2._M_pi = local_48.expression.
                  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_60.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    this_00._M_pi =
         local_60.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    local_60.constExpression = local_48.constExpression;
    if (local_48.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.expression.
                 super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    std::vector<Expression,_std::allocator<Expression>_>::push_back(list,&local_60);
    if (local_60.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      printError<>(this,token,"Parameter failure");
      bVar6 = false;
      Tokenizer::skipLookahead
                ((this->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer);
    }
  }
  uVar4 = ((long)(list->super__Vector_base<Expression,_std::allocator<Expression>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(list->super__Vector_base<Expression,_std::allocator<Expression>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar4 < (ulong)(long)local_64) {
    args = &local_64;
    text = "Not enough parameters (min %d)";
  }
  else {
    if (uVar4 < (ulong)(long)local_68 || uVar4 - (long)local_68 == 0) goto LAB_00145e79;
    text = "Too many parameters (max %d)";
  }
  printError<int>(this,token,text,args);
  bVar6 = false;
LAB_00145e79:
  if (local_60.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.expression.
               super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  return bVar6;
}

Assistant:

bool Parser::parseExpressionList(std::vector<Expression>& list, int min, int max)
{
	bool valid = true;
	list.clear();
	list.reserve(max >= 0 ? max : 32);

	const Token& start = peekToken();

	Expression exp = parseExpression();
	list.push_back(exp);

	if (!exp.isLoaded())
	{
		printError(start, "Parameter failure");
		getTokenizer()->skipLookahead();
		valid = false;
	}

	while (peekToken().type == TokenType::Comma)
	{
		eatToken();

		exp = parseExpression();
		list.push_back(exp);

		if (!exp.isLoaded())
		{
			printError(start, "Parameter failure");
			getTokenizer()->skipLookahead();
			valid = false;
		}
	}

	if (list.size() < (size_t) min)
	{
		printError(start, "Not enough parameters (min %d)",min);
		return false;
	}

	if (max != -1 && (size_t) max < list.size())
	{
		printError(start, "Too many parameters (max %d)",max);
		return false;
	}

	return valid;
}